

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ios_prop.h
# Opt level: O0

ios_info * booster::locale::impl::ios_prop<booster::locale::ios_info>::get(ios_base *ios)

{
  bool bVar1;
  void **ppvVar2;
  int id;
  ios_base *in_stack_ffffffffffffff88;
  ios_info *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  ios_base *in_stack_ffffffffffffffa0;
  ios_base *in_stack_ffffffffffffffb8;
  ios_info *in_stack_ffffffffffffffc0;
  ios_info *in_stack_ffffffffffffffd0;
  
  get_id();
  bVar1 = has(in_stack_ffffffffffffff88);
  if (!bVar1) {
    ios_info::ios_info(in_stack_ffffffffffffffd0);
    set(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    ios_info::~ios_info(in_stack_ffffffffffffff90);
  }
  ppvVar2 = std::ios_base::pword(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  return (ios_info *)*ppvVar2;
}

Assistant:

static Property &get(std::ios_base &ios)
                {
                    int id=get_id();
                    if(!has(ios))
                        set(Property(),ios);
                    return *static_cast<Property *>(ios.pword(id));
                }